

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentBase.hpp
# Opt level: O2

bool __thiscall cppjieba::SegmentBase::ResetSeparators(SegmentBase *this,string *s)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  __ireturn_type _Var5;
  string asStack_318 [32];
  Logger local_2f8;
  RuneStrArray runes;
  
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->symbols_)._M_h);
  memset(&runes,0,0x140);
  runes.size_ = 0;
  runes.capacity_ = 0x10;
  runes.ptr_ = runes.buffer_;
  bVar1 = DecodeRunesInString(s,&runes);
  if (bVar1) {
    lVar4 = 0;
    for (uVar3 = 0; uVar3 < runes.size_; uVar3 = uVar3 + 1) {
      _Var5 = std::__detail::
              _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)&this->symbols_,(value_type *)((long)&(runes.ptr_)->rune + lVar4));
      if (((undefined1  [16])_Var5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        limonp::Logger::Logger
                  (&local_2f8,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/SegmentBase.hpp"
                   ,0x22);
        std::__cxx11::string::substr((ulong)asStack_318,(ulong)s);
        poVar2 = std::operator<<((ostream *)&local_2f8,asStack_318);
        std::operator<<(poVar2," already exists");
        std::__cxx11::string::~string(asStack_318);
        goto LAB_001464bd;
      }
      lVar4 = lVar4 + 0x14;
    }
    bVar1 = true;
  }
  else {
    limonp::Logger::Logger
              (&local_2f8,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/SegmentBase.hpp"
               ,0x1d);
    poVar2 = std::operator<<((ostream *)&local_2f8,"decode ");
    poVar2 = std::operator<<(poVar2,(string *)s);
    std::operator<<(poVar2," failed");
LAB_001464bd:
    limonp::Logger::~Logger(&local_2f8);
    bVar1 = false;
  }
  limonp::LocalVector<cppjieba::RuneStr>::~LocalVector(&runes);
  return bVar1;
}

Assistant:

bool ResetSeparators(const string& s) {
    symbols_.clear();
    RuneStrArray runes;
    if (!DecodeRunesInString(s, runes)) {
      XLOG(ERROR) << "decode " << s << " failed";
      return false;
    }
    for (size_t i = 0; i < runes.size(); i++) {
      if (!symbols_.insert(runes[i].rune).second) {
        XLOG(ERROR) << s.substr(runes[i].offset, runes[i].len) << " already exists";
        return false;
      }
    }
    return true;
  }